

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmpolicytctocsv.cpp
# Opt level: O2

void fmpolicytctocsv::doit(bool skipheader)

{
  size_t sVar1;
  undefined7 in_register_00000039;
  fm_policyTC q;
  
  if ((int)CONCAT71(in_register_00000039,skipheader) == 0) {
    puts("layer_id,level_id,agg_id,profile_id");
  }
  sVar1 = fread(&q,0x10,1,_stdin);
  while (sVar1 != 0) {
    printf(" %d, %d, %d, %d\n",(ulong)(uint)q.layer_id,(ulong)(uint)q.level_id,(ulong)(uint)q.agg_id
           ,(ulong)(uint)q.profile_id);
    sVar1 = fread(&q,0x10,1,_stdin);
  }
  return;
}

Assistant:

void doit(bool skipheader)
	{

		if (skipheader == false)  printf("layer_id,level_id,agg_id,profile_id\n");

		fm_policyTC q;
		size_t i = fread(&q, sizeof(q), 1, stdin);
		while (i != 0) {
			printf(" %d, %d, %d, %d\n", q.layer_id, q.level_id, q.agg_id, q.profile_id);
			i = fread(&q, sizeof(q), 1, stdin);
		}
	}